

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

P_Sequence * parse(s_i *prog)

{
  pointer *__return_storage_ptr__;
  Pattern *p;
  P_Sequence *pPVar1;
  vector<Token_*,_std::allocator<Token_*>_> local_70;
  vector<Token_*,_std::allocator<Token_*>_> local_58;
  undefined1 local_40 [8];
  vector<Token_*,_std::allocator<Token_*>_> tokens1;
  vector<Token_*,_std::allocator<Token_*>_> tokens0;
  s_i *prog_local;
  
  __return_storage_ptr__ =
       &tokens1.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  tokenize((vector<Token_*,_std::allocator<Token_*>_> *)__return_storage_ptr__,prog);
  std::vector<Token_*,_std::allocator<Token_*>_>::vector
            (&local_70,(vector<Token_*,_std::allocator<Token_*>_> *)__return_storage_ptr__);
  attach_assertion_directions(&local_58,&local_70);
  insert_concatenators((vector<Token_*,_std::allocator<Token_*>_> *)local_40,&local_58);
  std::vector<Token_*,_std::allocator<Token_*>_>::~vector(&local_58);
  std::vector<Token_*,_std::allocator<Token_*>_>::~vector(&local_70);
  p = parse_tokenized((vector<Token_*,_std::allocator<Token_*>_> *)local_40);
  pPVar1 = compile_top(p);
  std::vector<Token_*,_std::allocator<Token_*>_>::~vector
            ((vector<Token_*,_std::allocator<Token_*>_> *)local_40);
  std::vector<Token_*,_std::allocator<Token_*>_>::~vector
            ((vector<Token_*,_std::allocator<Token_*>_> *)
             &tokens1.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return pPVar1;
}

Assistant:

P_Sequence * parse(s_i &prog) {
    auto tokens0 = tokenize(prog);
    auto tokens1 = insert_concatenators(attach_assertion_directions(tokens0));
#ifdef DEBUG_PARSER
    std::cerr << "Preliminary tokens:";
    for (Token* t : tokens0) std::cerr << ' ' << (str)*t;
    std::cerr << "\nModified tokens:";
    for (Token* t : tokens1) std::cerr << ' ' << (str)*t;
    std::cerr << '\n';
#endif
    return compile_top(parse_tokenized(tokens1));
}